

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O3

void __thiscall intel_acbp_v2_t::_clean_up(intel_acbp_v2_t *this)

{
  return;
}

Assistant:

intel_acbp_v2_t::acbp_element_t::acbp_element_t(kaitai::kstream* p__io, intel_acbp_v2_t* p__parent, intel_acbp_v2_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_header = nullptr;
    m_ibbs_body = nullptr;
    m_pmda_body = nullptr;
    _read();
}